

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplePacketizerReader.h
# Opt level: O0

void __thiscall
SimplePacketizerReader::setMPLSInfo
          (SimplePacketizerReader *this,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  uint32_t uVar1;
  bool bVar2;
  reference pvVar3;
  vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo_local;
  SimplePacketizerReader *this_local;
  
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator=(&this->m_mplsInfo,mplsInfo);
  bVar2 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::empty(&this->m_mplsInfo);
  if (bVar2) {
    this->m_curMplsIndex = -1;
  }
  else {
    this->m_curMplsIndex = 0;
    pvVar3 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       (&this->m_mplsInfo,0);
    uVar1 = pvVar3->OUT_time;
    pvVar3 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                       (&this->m_mplsInfo,0);
    this->m_lastMplsTime = (double)(uVar1 - pvVar3->IN_time) * 117600.0;
  }
  return;
}

Assistant:

void setMPLSInfo(const std::vector<MPLSPlayItem>& mplsInfo)
    {
        m_mplsInfo = mplsInfo;
        if (!m_mplsInfo.empty())
        {
            m_curMplsIndex = 0;
            m_lastMplsTime = (m_mplsInfo[0].OUT_time - m_mplsInfo[0].IN_time) * (INTERNAL_PTS_FREQ / 45000.0);
        }
        else
            m_curMplsIndex = -1;
    }